

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc.c
# Opt level: O3

void dumb_it_add_lpc(DUMB_IT_SIGDATA *sigdata)

{
  byte bVar1;
  IT_SAMPLE *pIVar2;
  long lVar3;
  void *pvVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  float *pfVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  float *pfVar12;
  float *pfVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint n;
  uint uVar17;
  byte bVar18;
  float fVar19;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float lpc [64];
  float lpc_output [128];
  float lpc_input [512];
  float afStack_cb8 [32];
  float local_c38 [28];
  float local_bc8 [164];
  float afStack_938 [64];
  float local_838 [256];
  float local_438 [258];
  
  bVar18 = 0;
  if (0 < sigdata->n_samples) {
    iVar16 = 0;
    do {
      pIVar2 = sigdata->sample;
      bVar1 = pIVar2[iVar16].flags;
      if ((bVar1 & 0x11) == 1) {
        uVar17 = pIVar2[iVar16].length;
        if ((int)uVar17 < 0x20) {
          bVar5 = bVar1 >> 1 & 1;
          iVar15 = 2 - (uint)((bVar1 & 4) == 0) << bVar5;
          pIVar2[iVar16].length = uVar17 + 0x40;
          iVar14 = uVar17 << (char)((bVar1 & 4) >> 2) + bVar5;
          uVar17 = iVar15 * 0x40;
          pvVar4 = realloc(pIVar2[iVar16].data,(long)(int)(iVar14 + uVar17));
          pIVar2[iVar16].data = pvVar4;
          memset((void *)((long)iVar14 + (long)pvVar4),0,(ulong)uVar17);
          iVar16 = iVar15;
        }
        else {
          n = 0x100;
          if (uVar17 < 0x100) {
            n = uVar17;
          }
          iVar14 = uVar17 - n;
          pvVar4 = pIVar2[iVar16].data;
          uVar9 = (ulong)n;
          if ((bVar1 & 4) == 0) {
            if ((bVar1 & 2) == 0) {
              uVar6 = 0;
              do {
                local_838[uVar6] = (float)(int)*(char *)((long)pvVar4 + uVar6 + (long)iVar14);
                uVar6 = uVar6 + 1;
              } while (uVar9 != uVar6);
            }
            else {
              uVar6 = 0;
              do {
                local_838[uVar6] =
                     (float)(int)*(short *)((long)pvVar4 + uVar6 * 2 + (long)iVar14 * 2);
                uVar6 = uVar6 + 1;
              } while (uVar9 != uVar6);
            }
            vorbis_lpc_from_data(local_838,afStack_cb8,n,0x20);
            lVar3 = 0x20;
            pfVar8 = local_bc8 + 0x84;
            pfVar12 = local_838 + (uVar9 - 0x20);
            pfVar13 = pfVar8;
            for (lVar7 = 0x20; lVar7 != 0; lVar7 = lVar7 + -1) {
              *pfVar13 = *pfVar12;
              pfVar12 = pfVar12 + (ulong)bVar18 * -2 + 1;
              pfVar13 = pfVar13 + (ulong)bVar18 * -2 + 1;
            }
            lVar7 = 0;
            do {
              fVar19 = 0.0;
              fVar24 = 0.0;
              fVar25 = 0.0;
              fVar26 = 0.0;
              lVar10 = 0x1c;
              pfVar12 = pfVar8;
              do {
                fVar19 = fVar19 - afStack_cb8[lVar10 + 3] * *pfVar12;
                fVar24 = fVar24 - afStack_cb8[lVar10 + 2] * pfVar12[1];
                fVar25 = fVar25 - afStack_cb8[lVar10 + 1] * pfVar12[2];
                fVar26 = fVar26 - afStack_cb8[lVar10] * pfVar12[3];
                lVar10 = lVar10 + -4;
                pfVar12 = pfVar12 + 4;
              } while (lVar10 != -4);
              fVar19 = fVar26 + fVar24 + fVar25 + fVar19;
              afStack_938[lVar3 + -0x20] = fVar19;
              local_bc8[lVar7 + 4] = fVar19;
              lVar7 = lVar7 + 1;
              lVar3 = lVar3 + 1;
              pfVar8 = pfVar8 + 1;
            } while (lVar7 != 0x40);
            sVar11 = (long)pIVar2[iVar16].length + 0x40;
            if ((pIVar2[iVar16].flags & 2) == 0) {
              pvVar4 = realloc(pIVar2[iVar16].data,sVar11);
              pIVar2[iVar16].data = pvVar4;
              iVar14 = pIVar2[iVar16].length;
              pIVar2[iVar16].length = iVar14 + 0x40;
              lVar3 = 0;
              do {
                auVar20._0_4_ = (int)local_bc8[lVar3 + 4];
                auVar20._4_4_ = (int)local_bc8[lVar3 + 5];
                auVar20._8_4_ = (int)local_bc8[lVar3 + 6];
                auVar20._12_4_ = (int)local_bc8[lVar3 + 7];
                auVar21 = packssdw(auVar20,auVar20);
                auVar21 = packsswb(auVar21,auVar21);
                *(int *)((long)pvVar4 + lVar3 + iVar14) = auVar21._0_4_;
                lVar3 = lVar3 + 4;
              } while (lVar3 != 0x40);
            }
            else {
              pvVar4 = realloc(pIVar2[iVar16].data,sVar11 * 2);
              pIVar2[iVar16].data = pvVar4;
              iVar14 = pIVar2[iVar16].length;
              pIVar2[iVar16].length = iVar14 + 0x40;
              lVar3 = 0;
              do {
                auVar23._0_4_ = (int)local_bc8[lVar3 + 4];
                auVar23._4_4_ = (int)local_bc8[lVar3 + 5];
                auVar23._8_4_ = (int)local_bc8[lVar3 + 6];
                auVar23._12_4_ = (int)local_bc8[lVar3 + 7];
                auVar21 = packssdw(auVar23,auVar23);
                *(long *)((long)pvVar4 + lVar3 * 2 + (long)iVar14 * 2) = auVar21._0_8_;
                lVar3 = lVar3 + 4;
              } while (lVar3 != 0x40);
            }
          }
          else {
            lVar3 = (long)(iVar14 * 2);
            if ((bVar1 & 2) == 0) {
              uVar6 = 0;
              do {
                local_838[uVar6] = (float)(int)*(char *)((long)pvVar4 + uVar6 * 2 + lVar3);
                local_438[uVar6] = (float)(int)*(char *)((long)pvVar4 + uVar6 * 2 + lVar3 + 1);
                uVar6 = uVar6 + 1;
              } while (uVar9 != uVar6);
            }
            else {
              uVar6 = 0;
              do {
                local_838[uVar6] = (float)(int)*(short *)((long)pvVar4 + uVar6 * 4 + lVar3 * 2);
                local_438[uVar6] = (float)(int)*(short *)((long)pvVar4 + uVar6 * 4 + lVar3 * 2 + 2);
                uVar6 = uVar6 + 1;
              } while (uVar9 != uVar6);
            }
            vorbis_lpc_from_data(local_838,afStack_cb8,n,0x20);
            vorbis_lpc_from_data(local_438,local_c38,n,0x20);
            lVar3 = 0x20;
            pfVar8 = local_bc8 + 0x84;
            pfVar12 = local_838 + (uVar9 - 0x20);
            pfVar13 = pfVar8;
            for (lVar7 = 0x20; lVar7 != 0; lVar7 = lVar7 + -1) {
              *pfVar13 = *pfVar12;
              pfVar12 = pfVar12 + (ulong)bVar18 * -2 + 1;
              pfVar13 = pfVar13 + (ulong)bVar18 * -2 + 1;
            }
            lVar7 = 0;
            do {
              fVar19 = 0.0;
              fVar24 = 0.0;
              fVar25 = 0.0;
              fVar26 = 0.0;
              lVar10 = 0x1c;
              pfVar12 = pfVar8;
              do {
                fVar19 = fVar19 - afStack_cb8[lVar10 + 3] * *pfVar12;
                fVar24 = fVar24 - afStack_cb8[lVar10 + 2] * pfVar12[1];
                fVar25 = fVar25 - afStack_cb8[lVar10 + 1] * pfVar12[2];
                fVar26 = fVar26 - afStack_cb8[lVar10] * pfVar12[3];
                lVar10 = lVar10 + -4;
                pfVar12 = pfVar12 + 4;
              } while (lVar10 != -4);
              fVar19 = fVar26 + fVar24 + fVar25 + fVar19;
              afStack_938[lVar3 + -0x20] = fVar19;
              local_bc8[lVar7 + 4] = fVar19;
              lVar7 = lVar7 + 1;
              lVar3 = lVar3 + 1;
              pfVar8 = pfVar8 + 1;
            } while (lVar7 != 0x40);
            lVar3 = 0x20;
            pfVar8 = local_bc8 + 0x84;
            pfVar12 = local_438 + (uVar9 - 0x20);
            pfVar13 = pfVar8;
            for (lVar7 = 0x20; lVar7 != 0; lVar7 = lVar7 + -1) {
              *pfVar13 = *pfVar12;
              pfVar12 = pfVar12 + (ulong)bVar18 * -2 + 1;
              pfVar13 = pfVar13 + (ulong)bVar18 * -2 + 1;
            }
            lVar7 = 0;
            do {
              fVar19 = 0.0;
              fVar24 = 0.0;
              fVar25 = 0.0;
              fVar26 = 0.0;
              lVar10 = 0;
              pfVar12 = local_bc8;
              do {
                pfVar13 = pfVar8 + lVar10;
                fVar19 = fVar19 - pfVar12[3] * *pfVar13;
                fVar24 = fVar24 - pfVar12[2] * pfVar13[1];
                fVar25 = fVar25 - pfVar12[1] * pfVar13[2];
                fVar26 = fVar26 - *pfVar12 * pfVar13[3];
                lVar10 = lVar10 + 4;
                pfVar12 = pfVar12 + -4;
              } while (lVar10 != 0x20);
              fVar19 = fVar26 + fVar24 + fVar25 + fVar19;
              afStack_938[lVar3 + -0x20] = fVar19;
              local_bc8[lVar7 + 0x44] = fVar19;
              lVar7 = lVar7 + 1;
              lVar3 = lVar3 + 1;
              pfVar8 = pfVar8 + 1;
            } while (lVar7 != 0x40);
            sVar11 = (size_t)(pIVar2[iVar16].length * 2 + 0x80);
            if ((pIVar2[iVar16].flags & 2) == 0) {
              pvVar4 = realloc(pIVar2[iVar16].data,sVar11);
              pIVar2[iVar16].data = pvVar4;
              iVar14 = pIVar2[iVar16].length;
              pIVar2[iVar16].length = iVar14 + 0x40;
              lVar3 = 0;
              do {
                auVar22._0_4_ = (int)local_bc8[lVar3 + 6];
                auVar22._4_4_ = (int)local_bc8[lVar3 + 0x46];
                auVar22._8_4_ = (int)local_bc8[lVar3 + 7];
                auVar22._12_4_ = (int)local_bc8[lVar3 + 0x47];
                auVar27._0_4_ = (int)local_bc8[lVar3 + 4];
                auVar27._4_4_ = (int)local_bc8[lVar3 + 0x44];
                auVar27._8_4_ = (int)local_bc8[lVar3 + 5];
                auVar27._12_4_ = (int)local_bc8[lVar3 + 0x45];
                auVar21 = packssdw(auVar27,auVar22);
                auVar21 = packsswb(auVar21,auVar21);
                *(long *)((long)pvVar4 + lVar3 * 2 + (long)iVar14 * 2) = auVar21._0_8_;
                lVar3 = lVar3 + 4;
              } while (lVar3 != 0x40);
            }
            else {
              pvVar4 = realloc(pIVar2[iVar16].data,sVar11 * 2);
              pIVar2[iVar16].data = pvVar4;
              iVar14 = pIVar2[iVar16].length;
              pIVar2[iVar16].length = iVar14 + 0x40;
              lVar3 = 0;
              do {
                auVar21._0_4_ = (int)local_bc8[lVar3 + 6];
                auVar21._4_4_ = (int)local_bc8[lVar3 + 0x46];
                auVar21._8_4_ = (int)local_bc8[lVar3 + 7];
                auVar21._12_4_ = (int)local_bc8[lVar3 + 0x47];
                auVar28._0_4_ = (int)local_bc8[lVar3 + 4];
                auVar28._4_4_ = (int)local_bc8[lVar3 + 0x44];
                auVar28._8_4_ = (int)local_bc8[lVar3 + 5];
                auVar28._12_4_ = (int)local_bc8[lVar3 + 0x45];
                auVar21 = packssdw(auVar28,auVar21);
                *(undefined1 (*) [16])((long)pvVar4 + lVar3 * 4 + (long)iVar14 * 4) = auVar21;
                lVar3 = lVar3 + 4;
              } while (lVar3 != 0x40);
            }
          }
        }
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 < sigdata->n_samples);
  }
  return;
}

Assistant:

void dumb_it_add_lpc(struct DUMB_IT_SIGDATA *sigdata){
    float lpc[lpc_order * 2];
    float lpc_input[lpc_max * 2];
    float lpc_output[lpc_extra * 2];

    signed char * s8;
    signed short * s16;

    int n, o, offset, lpc_samples;

    for ( n = 0; n < sigdata->n_samples; n++ ) {
        IT_SAMPLE * sample = sigdata->sample + n;
        if ( ( sample->flags & ( IT_SAMPLE_EXISTS | IT_SAMPLE_LOOP) ) == IT_SAMPLE_EXISTS ) {
            /* If we have enough sample data to train the filter, use the filter to generate the padding */
            if ( sample->length >= lpc_order ) {
                lpc_samples = sample->length;
                if (lpc_samples > lpc_max) lpc_samples = lpc_max;
                offset = sample->length - lpc_samples;

                if ( sample->flags & IT_SAMPLE_STEREO )
                {
                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) sample->data;
                        s16 += offset * 2;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s16[ o * 2 + 0 ];
                            lpc_input[ o + lpc_max ] = s16[ o * 2 + 1 ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) sample->data;
                        s8 += offset * 2;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s8[ o * 2 + 0 ];
                            lpc_input[ o + lpc_max ] = s8[ o * 2 + 1 ];
                        }
                    }

                    vorbis_lpc_from_data( lpc_input, lpc, lpc_samples, lpc_order );
                    vorbis_lpc_from_data( lpc_input + lpc_max, lpc + lpc_order, lpc_samples, lpc_order );

                    vorbis_lpc_predict( lpc, lpc_input + lpc_samples - lpc_order, lpc_order, lpc_output, lpc_extra );
                    vorbis_lpc_predict( lpc + lpc_order, lpc_input + lpc_max + lpc_samples - lpc_order, lpc_order, lpc_output + lpc_extra, lpc_extra );

                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) realloc( sample->data, ( sample->length + lpc_extra ) * 2 * sizeof(short) );
                        sample->data = s16;

                        s16 += sample->length * 2;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s16[ o * 2 + 0 ] = (signed short)lpc_output[ o ];
                            s16[ o * 2 + 1 ] = (signed short)lpc_output[ o + lpc_extra ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) realloc( sample->data, ( sample->length + lpc_extra ) * 2 );
                        sample->data = s8;

                        s8 += sample->length * 2;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s8[ o * 2 + 0 ] = (signed char)lpc_output[ o ];
                            s8[ o * 2 + 1 ] = (signed char)lpc_output[ o + lpc_extra ];
                        }
                    }
                }
                else
                {
                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) sample->data;
                        s16 += offset;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s16[ o ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) sample->data;
                        s8 += offset;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s8[ o ];
                        }
                    }

                    vorbis_lpc_from_data( lpc_input, lpc, lpc_samples, lpc_order );

                    vorbis_lpc_predict( lpc, lpc_input + lpc_samples - lpc_order, lpc_order, lpc_output, lpc_extra );

                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) realloc( sample->data, ( sample->length + lpc_extra ) * sizeof(short) );
                        sample->data = s16;

                        s16 += sample->length;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s16[ o ] = (signed short)lpc_output[ o ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) realloc( sample->data, sample->length + lpc_extra );
                        sample->data = s8;

                        s8 += sample->length;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s8[ o ] = (signed char)lpc_output[ o ];
                        }
                    }
                }
            }
            else
            /* Otherwise, pad with silence. */
            {
                offset = sample->length;
                lpc_samples = lpc_extra;

                sample->length += lpc_samples;

                n = 1;
                if ( sample->flags & IT_SAMPLE_STEREO ) n *= 2;
                if ( sample->flags & IT_SAMPLE_16BIT ) n *= 2;

                offset *= n;
                lpc_samples *= n;

                sample->data = realloc( sample->data, offset + lpc_samples );
                memset( (char*)sample->data + offset, 0, lpc_samples );
            }
        }
    }
}